

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::WithFunctionSampleSyntax::setChild
          (WithFunctionSampleSyntax *this,size_t index,TokenOrSyntax child)

{
  undefined8 uVar1;
  SyntaxNode *pSVar2;
  FunctionPortListSyntax *pFVar3;
  logic_error *this_00;
  Token TVar4;
  long lStack_f0;
  allocator<char> local_e1;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (index < 4) {
    switch(index) {
    case 0:
      TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      pFVar3 = (FunctionPortListSyntax *)TVar4.info;
      uVar1 = TVar4._0_8_;
      (this->with).kind = (short)uVar1;
      (this->with).field_0x2 = (char)((ulong)uVar1 >> 0x10);
      (this->with).numFlags = (NumericTokenFlags)(char)((ulong)uVar1 >> 0x18);
      (this->with).rawLen = (int)((ulong)uVar1 >> 0x20);
      lStack_f0 = 0x18;
      break;
    case 1:
      TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      pFVar3 = (FunctionPortListSyntax *)TVar4.info;
      uVar1 = TVar4._0_8_;
      (this->function).kind = (short)uVar1;
      (this->function).field_0x2 = (char)((ulong)uVar1 >> 0x10);
      (this->function).numFlags = (NumericTokenFlags)(char)((ulong)uVar1 >> 0x18);
      (this->function).rawLen = (int)((ulong)uVar1 >> 0x20);
      lStack_f0 = 0x28;
      break;
    case 2:
      TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      pFVar3 = (FunctionPortListSyntax *)TVar4.info;
      uVar1 = TVar4._0_8_;
      (this->sample).kind = (short)uVar1;
      (this->sample).field_0x2 = (char)((ulong)uVar1 >> 0x10);
      (this->sample).numFlags = (NumericTokenFlags)(char)((ulong)uVar1 >> 0x18);
      (this->sample).rawLen = (int)((ulong)uVar1 >> 0x20);
      lStack_f0 = 0x38;
      break;
    case 3:
      pSVar2 = TokenOrSyntax::node(&child);
      lStack_f0 = 0x40;
      if (pSVar2 == (SyntaxNode *)0x0) {
        pFVar3 = (FunctionPortListSyntax *)0x0;
      }
      else {
        pSVar2 = TokenOrSyntax::node(&child);
        pFVar3 = SyntaxNode::as<slang::syntax::FunctionPortListSyntax>(pSVar2);
      }
    }
    *(FunctionPortListSyntax **)((long)&(this->super_SyntaxNode).parent + lStack_f0) = pFVar3;
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
             ,&local_e1);
  std::operator+(&local_a0,&local_c0,":");
  std::__cxx11::to_string(&local_e0,0x377b);
  std::operator+(&local_80,&local_a0,&local_e0);
  std::operator+(&local_60,&local_80,": ");
  std::operator+(&local_40,&local_60,"Default case should be unreachable!");
  std::logic_error::logic_error(this_00,(string *)&local_40);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void WithFunctionSampleSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: with = child.token(); return;
        case 1: function = child.token(); return;
        case 2: sample = child.token(); return;
        case 3: portList = child.node() ? &child.node()->as<FunctionPortListSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}